

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrload.c
# Opt level: O0

FT_Error pfr_aux_name_load(FT_Byte *p,FT_UInt len,FT_Memory memory,FT_String **astring)

{
  bool bVar1;
  uint local_3c;
  FT_UInt ok;
  FT_UInt n;
  FT_String *result;
  FT_String **ppFStack_28;
  FT_Error error;
  FT_String **astring_local;
  FT_Memory memory_local;
  FT_Byte *pFStack_10;
  FT_UInt len_local;
  FT_Byte *p_local;
  
  result._4_4_ = 0;
  _ok = (FT_String *)0x0;
  ppFStack_28 = astring;
  astring_local = (FT_String **)memory;
  memory_local._4_4_ = len;
  pFStack_10 = p;
  if (*astring != (FT_String *)0x0) {
    ft_mem_free(memory,*astring);
    *ppFStack_28 = (FT_String *)0x0;
  }
  if ((memory_local._4_4_ != 0) && (pFStack_10[memory_local._4_4_ - 1] == '\0')) {
    memory_local._4_4_ = memory_local._4_4_ - 1;
  }
  bVar1 = memory_local._4_4_ != 0;
  local_3c = 0;
  do {
    if (memory_local._4_4_ <= local_3c) {
LAB_001696a7:
      if ((bVar1) &&
         (_ok = (FT_String *)
                ft_mem_alloc((FT_Memory)astring_local,(ulong)(memory_local._4_4_ + 1),
                             (FT_Error *)((long)&result + 4)), result._4_4_ == 0)) {
        memcpy(_ok,pFStack_10,(ulong)memory_local._4_4_);
        _ok[memory_local._4_4_] = '\0';
      }
      *ppFStack_28 = _ok;
      return result._4_4_;
    }
    if ((pFStack_10[local_3c] < 0x20) || (0x7f < pFStack_10[local_3c])) {
      bVar1 = false;
      goto LAB_001696a7;
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

static FT_Error
  pfr_aux_name_load( FT_Byte*     p,
                     FT_UInt      len,
                     FT_Memory    memory,
                     FT_String*  *astring )
  {
    FT_Error    error  = FT_Err_Ok;
    FT_String*  result = NULL;
    FT_UInt     n, ok;


    if ( *astring )
      FT_FREE( *astring );

    if ( len > 0 && p[len - 1] == 0 )
      len--;

    /* check that each character is ASCII  */
    /* for making sure not to load garbage */
    ok = ( len > 0 );
    for ( n = 0; n < len; n++ )
      if ( p[n] < 32 || p[n] > 127 )
      {
        ok = 0;
        break;
      }

    if ( ok )
    {
      if ( FT_ALLOC( result, len + 1 ) )
        goto Exit;

      FT_MEM_COPY( result, p, len );
      result[len] = 0;
    }

  Exit:
    *astring = result;
    return error;
  }